

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O3

int Saig_ManReadNumber(Aig_Man_t *p,char *pToken)

{
  char cVar1;
  int iVar2;
  long lVar3;
  
  cVar1 = *pToken;
  if (cVar1 != 'l') {
    lVar3 = 1;
    if (cVar1 == 'n') goto LAB_0062aec7;
    if (cVar1 != 'p') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIoa.c"
                    ,0xb6,"int Saig_ManReadNumber(Aig_Man_t *, char *)");
    }
  }
  lVar3 = 2;
LAB_0062aec7:
  iVar2 = atoi(pToken + lVar3);
  return iVar2;
}

Assistant:

int Saig_ManReadNumber( Aig_Man_t * p, char * pToken )
{
    if ( pToken[0] == 'n' )
        return atoi( pToken + 1 );
    if ( pToken[0] == 'p' )
        return atoi( pToken + 2 );
    if ( pToken[0] == 'l' )
        return atoi( pToken + 2 );
    assert( 0 );
    return -1;
}